

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O2

string * __thiscall
CoreML::componentsJoinedBy<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,CoreML *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container,string *sep)

{
  string *psVar1;
  const_iterator it;
  string *psVar2;
  ostringstream ss;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  psVar2 = *(string **)this;
  psVar1 = *(string **)(this + 8);
  if (psVar1 != psVar2 && -1 < (long)psVar1 - (long)psVar2) {
    for (; psVar2 != psVar1 + -0x20; psVar2 = psVar2 + 0x20) {
      std::operator<<((ostream *)local_1a0,psVar2);
      std::operator<<((ostream *)local_1a0,(string *)container);
    }
    std::operator<<((ostream *)local_1a0,psVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string componentsJoinedBy(const Container& container, const std::string& sep) {
        auto ss = std::ostringstream();
        auto beg = std::begin(container);
        auto end = std::end(container);
        if (std::distance(beg, end) > 0) {
            auto it = beg;
            for (; it != end - 1; ++it) {
                ss << *it;
                ss << sep;
            }
            ss << *it;
        }
        return ss.str();
    }